

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>::
emplaceValue<QXmlStreamReaderPrivate::Entity>
          (Node<QStringView,_QXmlStreamReaderPrivate::Entity> *this,Entity *args)

{
  long in_FS_OFFSET;
  Entity local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReaderPrivate::Entity::Entity(&local_50,args);
  QXmlStreamReaderPrivate::Entity::operator=(&this->value,&local_50);
  QXmlStreamReaderPrivate::Entity::~Entity(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }